

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall rcg::Device::getRemoteNodeMap(Device *this,char *xml)

{
  int iVar1;
  CPort *this_00;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar2;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *local_58;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(xml + 0x50))->__data);
  if ((*(long *)(xml + 0x80) != 0) && (*(long *)(xml + 0xf8) == 0)) {
    iVar1 = (**(code **)(*(long *)(xml + 0x20) + 0xf0))(*(long *)(xml + 0x80),xml + 0x88);
    if (iVar1 == 0) {
      this_00 = (CPort *)operator_new(0x20);
      local_58 = (__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *)(xml + 0x20);
      std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,local_58);
      CPort::CPort(this_00,(shared_ptr<const_rcg::GenTLWrapper> *)&local_50,(void **)(xml + 0x88));
      std::__shared_ptr<rcg::CPort,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::CPort,void>
                ((__shared_ptr<rcg::CPort,(__gnu_cxx::_Lock_policy)2> *)&local_68,this_00);
      std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *)(xml + 0xd8),&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,local_58);
      allocNodeMap((rcg *)&local_68,(shared_ptr<const_rcg::GenTLWrapper> *)&local_40,
                   *(void **)(xml + 0x88),*(CPort **)(xml + 0xd8),in_RDX);
      std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)(xml + 0xf8),
                 (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)(xml + 0xf8));
  pthread_mutex_unlock((pthread_mutex_t *)(xml + 0x50));
  sVar2.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar2.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> Device::getRemoteNodeMap(const char *xml)
{
  std::lock_guard<std::mutex> lock(mtx);

  if (dev != 0 && !rnodemap)
  {
    if (gentl->DevGetPort(dev, &rp) == GenTL::GC_ERR_SUCCESS)
    {
      rport=std::shared_ptr<CPort>(new CPort(gentl, &rp));
      rnodemap=allocNodeMap(gentl, rp, rport.get(), xml);
    }
  }

  return rnodemap;
}